

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O0

void __thiscall iutest::TestEnv::Variable::Variable(Variable *this)

{
  Variable *this_local;
  
  this->m_random_seed = 0;
  this->m_current_random_seed = 0;
  this->m_before_origin_random_seed = 0;
  this->m_repeat_count = 1;
  StateVariable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StateVariable(&this->m_output_option);
  std::__cxx11::string::string((string *)&this->m_test_filter);
  std::__cxx11::string::string((string *)&this->m_flagfile);
  StateVariable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StateVariable(&this->m_stream_result_to);
  std::__cxx11::string::string((string *)&this->m_default_package_name);
  detail::iuRandom::iuRandom(&this->m_genrand);
  std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::vector
            (&this->m_environment_list);
  TestEventListeners::TestEventListeners(&this->m_event_listeners);
  this->m_testpartresult_reporter = (TestPartResultReporterInterface *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_ostream_formatter);
  std::__cxx11::string::string((string *)&this->m_locale_ctype);
  return;
}

Assistant:

Variable()
            : m_random_seed(0)
            , m_current_random_seed(0)
            , m_before_origin_random_seed(0)
            , m_repeat_count(1)
            , m_testpartresult_reporter(NULL)
        {}